

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void * ndiThreadFunc(void *userdata)

{
  size_t sVar1;
  int local_44;
  int *piStack_40;
  int errorCode_1;
  ndicapi *pol;
  char *reply;
  char *command;
  int local_20;
  int errorCode;
  int m;
  int i;
  void *userdata_local;
  
  command._4_4_ = 0;
  reply = *(char **)((long)userdata + 0x60);
  pol = *(ndicapi **)((long)userdata + 0x68);
  piStack_40 = (int *)userdata;
  _m = userdata;
  while( true ) {
    if (command._4_4_ != 0) {
      return (void *)0x0;
    }
    ndiMutexLock(*(pthread_mutex_t **)(piStack_40 + 0x12));
    if ((*(byte *)((long)piStack_40 + 0x39) & 1) == 0) break;
    if (*reply == '\0') {
      if (*piStack_40 == -1) {
        ndiSocketSleep(piStack_40[4],0x14);
      }
      else {
        ndiSerialSleep(*piStack_40,0x14);
      }
      ndiMutexUnlock(*(pthread_mutex_t **)(piStack_40 + 0x12));
    }
    else {
      if (*piStack_40 == -1) {
        ndiSocketFlush(piStack_40[4],1);
      }
      else {
        ndiSerialFlush(*piStack_40,1);
      }
      sVar1 = strlen(reply);
      errorCode = (int)sVar1;
      if (command._4_4_ == 0) {
        if (*piStack_40 == -1) {
          local_20 = ndiSocketWrite(piStack_40[4],reply,errorCode);
        }
        else {
          local_20 = ndiSerialWrite(*piStack_40,reply,errorCode);
        }
        if (local_20 < 0) {
          command._4_4_ = 0x104;
        }
        else if (local_20 < errorCode) {
          command._4_4_ = 0x103;
        }
      }
      if (command._4_4_ == 0) {
        if (*piStack_40 == -1) {
          local_20 = ndiSocketRead(piStack_40[4],(char *)pol,0x7ff,
                                   (bool)(*(byte *)(piStack_40 + 0x1e) & 1),&local_44);
        }
        else {
          local_20 = ndiSerialRead(*piStack_40,(char *)pol,0x7ff,
                                   (bool)(*(byte *)(piStack_40 + 0x1e) & 1),
                                   (int *)((long)&command + 4));
        }
        if (local_20 < 0) {
          command._4_4_ = 0x105;
          local_20 = 0;
        }
        else if (local_20 == 0) {
          command._4_4_ = 0x103;
        }
        *(undefined1 *)((long)&pol->SerialDevice + (long)local_20) = 0;
      }
      ndiMutexLock(*(pthread_mutex_t **)(piStack_40 + 0x14));
      strcpy(*(char **)(piStack_40 + 0x1c),(char *)pol);
      piStack_40[0x1f] = command._4_4_;
      ndiEventSignal(*(pl_cond_and_mutex_t **)(piStack_40 + 0x16));
      ndiMutexUnlock(*(pthread_mutex_t **)(piStack_40 + 0x14));
      ndiMutexUnlock(*(pthread_mutex_t **)(piStack_40 + 0x12));
    }
  }
  ndiMutexUnlock(*(pthread_mutex_t **)(piStack_40 + 0x12));
  return (void *)0x0;
}

Assistant:

static void* ndiThreadFunc(void* userdata)
{
  int i, m;
  int errorCode = 0;
  char* command, *reply;
  ndicapi* pol;

  pol = (ndicapi*)userdata;
  command = pol->ThreadCommand;
  reply = pol->ThreadReply;

  while (errorCode == 0)
  {
    // if the application is blocking us, we sit here and wait
    ndiMutexLock(pol->ThreadMutex);

    // quit if threading has been turned off
    if (!pol->IsThreadedMode)
    {
      ndiMutexUnlock(pol->ThreadMutex);
      return NULL;
    }

    // check whether we have a GX/BX/TX command ready to send
    if (command[0] == '\0')
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        ndiSerialSleep(pol->SerialDevice, 20);
      }
      else
      {
        ndiSocketSleep(pol->Socket, 20);
      }
      ndiMutexUnlock(pol->ThreadMutex);
      continue;
    }

    // flush the input buffer, because anything that we haven't read
    //   yet is garbage left over by a previously failed command
    if (pol->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialFlush(pol->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(pol->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    i = (int)strlen(command);
    if (errorCode == 0)
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        m = ndiSerialWrite(pol->SerialDevice, command, i);
      }
      else
      {
        m = ndiSocketWrite(pol->Socket, command, i);
      }
      if (m < 0)
      {
        errorCode = NDI_WRITE_ERROR;
      }
      else if (m < i)
      {
        errorCode = NDI_TIMEOUT;
      }
    }

    // read the reply from the Measurement System
    if (errorCode == 0)
    {
      if (pol->SerialDevice != NDI_INVALID_HANDLE)
      {
        m = ndiSerialRead(pol->SerialDevice, reply, 2047, pol->IsThreadedCommandBinary, &errorCode);
      }
      else
      {
        int errorCode;
        m = ndiSocketRead(pol->Socket, reply, 2047, pol->IsThreadedCommandBinary, &errorCode);
      }
      if (m < 0)
      {
        errorCode = NDI_READ_ERROR;
        m = 0;
      }
      else if (m == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      // terminate the string
      reply[m] = '\0';
    }

    // lock the buffer
    ndiMutexLock(pol->ThreadBufferMutex);
    // copy the reply into the buffer, also copy the error code
    strcpy(pol->ThreadBuffer, reply);
    pol->ThreadErrorCode = errorCode;
    // signal the main thread that a new data record is ready
    ndiEventSignal(pol->ThreadBufferEvent);
    // unlock the buffer
    ndiMutexUnlock(pol->ThreadBufferMutex);

    // release the lock to give the application a chance to block us
    ndiMutexUnlock(pol->ThreadMutex);
  }

  return NULL;
}